

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O0

void __thiscall
HighsDomain::conflictAnalyzeReconvergence
          (HighsDomain *this,HighsDomainChange *domchg,HighsInt *proofinds,double *proofvals,
          HighsInt prooflen,double proofrhs,HighsConflictPool *conflictPool)

{
  int iVar1;
  bool bVar2;
  pointer pHVar3;
  size_type sVar4;
  reference pvVar5;
  reference pvVar6;
  reference pvVar7;
  ulong uVar8;
  undefined1 *in_RDI;
  undefined4 in_R8D;
  LocalDomChg *in_R9;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  HighsInt branchPos;
  HighsInt depth;
  HighsCDouble activitymin;
  HighsInt ninfmin;
  ConflictSet conflictSet;
  vector<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
  *this_00;
  ConflictSet *in_stack_fffffffffffffe50;
  __normal_iterator<HighsDomain::ConflictSet::LocalDomChg_*,_std::vector<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>_>
  in_stack_fffffffffffffe58;
  double dVar9;
  __normal_iterator<HighsDomain::ConflictSet::LocalDomChg_*,_std::vector<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>_>
  __first;
  HighsDomain *in_stack_fffffffffffffe68;
  ConflictSet *in_stack_fffffffffffffe70;
  int local_144;
  HighsInt *in_stack_fffffffffffffec0;
  double *in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  undefined8 in_stack_fffffffffffffed8;
  HighsDomain *in_stack_fffffffffffffee0;
  HighsCDouble *in_stack_fffffffffffffef0;
  vector<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
  local_108 [4];
  HighsDomainChange *in_stack_ffffffffffffff68;
  set<HighsDomain::ConflictSet::LocalDomChg,_std::less<HighsDomain::ConflictSet::LocalDomChg>,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
  *in_stack_ffffffffffffff70;
  HighsDomain *in_stack_ffffffffffffff78;
  HighsConflictPool *in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff93;
  HighsInt in_stack_ffffffffffffff94;
  HighsInt in_stack_ffffffffffffff98;
  HighsInt in_stack_ffffffffffffff9c;
  pointer in_stack_ffffffffffffffa0;
  ConflictSet *in_stack_ffffffffffffffa8;
  HighsInt in_stack_ffffffffffffffb4;
  double *in_stack_ffffffffffffffb8;
  HighsInt *in_stack_ffffffffffffffc0;
  set<HighsDomain::ConflictSet::LocalDomChg,_std::less<HighsDomain::ConflictSet::LocalDomChg>,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
  *currentFrontier;
  undefined4 in_stack_ffffffffffffffd8;
  
  currentFrontier =
       (set<HighsDomain::ConflictSet::LocalDomChg,_std::less<HighsDomain::ConflictSet::LocalDomChg>,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
        *)CONCAT44(in_XMM0_Db,in_XMM0_Da);
  pHVar3 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                     ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                      0x5ca610);
  if (&pHVar3->domain != (HighsDomain *)in_RDI) {
    pHVar3 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
             operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                        0x5ca63d);
    bVar2 = infeasible(&pHVar3->domain);
    if (!bVar2) {
      std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                 0x5ca66f);
      propagate((HighsDomain *)
                conflictSet.reasonSideFrontier._M_t._M_impl.super__Rb_tree_header._M_header.
                _M_parent);
      pHVar3 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
               operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                           *)0x5ca696);
      bVar2 = infeasible(&pHVar3->domain);
      if (!bVar2) {
        ConflictSet::ConflictSet(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
        std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                  ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                   0x5ca6da);
        this_00 = local_108;
        computeMinActivity(in_stack_fffffffffffffee0,
                           (HighsInt)((ulong)in_stack_fffffffffffffed8 >> 0x20),
                           (HighsInt)in_stack_fffffffffffffed8,
                           (HighsInt *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0)
                           ,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                           in_stack_fffffffffffffef0);
        if (local_108[0].
            super__Vector_base<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
          std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::size
                    ((vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *)
                     (in_RDI + 0x48));
          HighsCDouble::operator_cast_to_double((HighsCDouble *)local_108);
          bVar2 = ConflictSet::explainBoundChangeLeq
                            ((ConflictSet *)CONCAT44(in_R8D,in_stack_ffffffffffffffd8),
                             currentFrontier,in_R9,in_stack_ffffffffffffffc0,
                             in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,
                             (double)in_stack_ffffffffffffffa8,(double)in_stack_ffffffffffffffa0);
          if (((bVar2 ^ 0xffU) & 1) == 0) {
            sVar4 = std::
                    vector<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
                    ::size((vector<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
                            *)&stack0xffffffffffffff98);
            uVar8 = sVar4 * 10;
            pHVar3 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
                     operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                                 *)0x5ca867);
            sVar4 = std::vector<int,_std::allocator<int>_>::size(&pHVar3->integral_cols);
            if (uVar8 <= sVar4 * 3 + 1000) {
              __first._M_current = (LocalDomChg *)&stack0xffffffffffffff98;
              std::
              vector<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
              ::begin(this_00);
              std::
              vector<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
              ::end(this_00);
              std::
              set<HighsDomain::ConflictSet::LocalDomChg,std::less<HighsDomain::ConflictSet::LocalDomChg>,std::allocator<HighsDomain::ConflictSet::LocalDomChg>>
              ::
              insert<__gnu_cxx::__normal_iterator<HighsDomain::ConflictSet::LocalDomChg*,std::vector<HighsDomain::ConflictSet::LocalDomChg,std::allocator<HighsDomain::ConflictSet::LocalDomChg>>>>
                        ((set<HighsDomain::ConflictSet::LocalDomChg,_std::less<HighsDomain::ConflictSet::LocalDomChg>,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
                          *)in_stack_fffffffffffffe50,__first,in_stack_fffffffffffffe58);
              sVar4 = std::vector<int,_std::allocator<int>_>::size
                                ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x2c0));
              for (local_144 = (int)sVar4; 0 < local_144; local_144 = local_144 + -1) {
                pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                                   ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x2c0),
                                    (long)(local_144 + -1));
                iVar1 = *pvVar5;
                pvVar6 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::
                         operator[]((vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *
                                    )(in_RDI + 0x48),(long)iVar1);
                dVar9 = pvVar6->boundval;
                pvVar7 = std::
                         vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::
                         operator[]((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                                     *)(in_RDI + 0x78),(long)iVar1);
                if ((dVar9 != pvVar7->first) || (NAN(dVar9) || NAN(pvVar7->first))) break;
              }
              ConflictSet::resolveDepth
                        (in_stack_ffffffffffffffa8,
                         (set<HighsDomain::ConflictSet::LocalDomChg,_std::less<HighsDomain::ConflictSet::LocalDomChg>,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
                          *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,
                         in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,
                         (bool)in_stack_ffffffffffffff93);
              HighsConflictPool::addReconvergenceCut
                        (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                         in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
            }
          }
        }
        ConflictSet::~ConflictSet(in_stack_fffffffffffffe50);
      }
    }
  }
  return;
}

Assistant:

void HighsDomain::conflictAnalyzeReconvergence(
    const HighsDomainChange& domchg, const HighsInt* proofinds,
    const double* proofvals, HighsInt prooflen, double proofrhs,
    HighsConflictPool& conflictPool) {
  if (&mipsolver->mipdata_->domain == this) return;

  if (mipsolver->mipdata_->domain.infeasible()) return;

  mipsolver->mipdata_->domain.propagate();
  if (mipsolver->mipdata_->domain.infeasible()) return;

  ConflictSet conflictSet(*this);

  HighsInt ninfmin;
  HighsCDouble activitymin;
  mipsolver->mipdata_->domain.computeMinActivity(
      0, prooflen, proofinds, proofvals, ninfmin, activitymin);
  if (ninfmin != 0) return;

  if (!conflictSet.explainBoundChangeLeq(
          conflictSet.reconvergenceFrontier,
          ConflictSet::LocalDomChg{HighsInt(domchgstack_.size()), domchg},
          proofinds, proofvals, prooflen, proofrhs, double(activitymin)))
    return;

  if (10 * conflictSet.resolvedDomainChanges.size() >
      1000 + 3 * mipsolver->mipdata_->integral_cols.size())
    return;

  conflictSet.reconvergenceFrontier.insert(
      conflictSet.resolvedDomainChanges.begin(),
      conflictSet.resolvedDomainChanges.end());

  HighsInt depth = branchPos_.size();

  while (depth > 0) {
    HighsInt branchPos = branchPos_[depth - 1];
    if (domchgstack_[branchPos].boundval != prevboundval_[branchPos].first)
      break;

    --depth;
  }

  conflictSet.resolveDepth(conflictSet.reconvergenceFrontier, depth, 0);
  conflictPool.addReconvergenceCut(*this, conflictSet.reconvergenceFrontier,
                                   domchg);
}